

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFNameTreeObjectHelper::Members::Members
          (Members *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f4790;
  NNTreeImpl::NNTreeImpl
            ((NNTreeImpl *)(p_Var1 + 1),&name_tree_details.super_NNTreeDetails,q,oh,auto_repair);
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  (this->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (NNTreeImpl *)(p_Var1 + 1);
  return;
}

Assistant:

QPDFNameTreeObjectHelper::Members::Members(QPDFObjectHandle& oh, QPDF& q, bool auto_repair) :
    impl(std::make_shared<NNTreeImpl>(name_tree_details, q, oh, auto_repair))
{
}